

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::DoesSampledImageReferenceImage
          (ConvertToSampledImagePass *this,Instruction *sampled_image_inst,
          Instruction *image_variable)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IRContext *this_00;
  DefUseManager *def_use_mgr_00;
  Instruction *pIVar4;
  undefined1 local_51;
  Instruction *image;
  Instruction *image_load;
  DefUseManager *def_use_mgr;
  Instruction *image_variable_local;
  Instruction *sampled_image_inst_local;
  ConvertToSampledImagePass *this_local;
  
  OVar1 = opt::Instruction::opcode(sampled_image_inst);
  if (OVar1 == OpSampledImage) {
    this_00 = Pass::context(&this->super_Pass);
    def_use_mgr_00 = IRContext::get_def_use_mgr(this_00);
    uVar2 = opt::Instruction::GetSingleWordInOperand(sampled_image_inst,0);
    pIVar4 = anon_unknown_19::GetNonCopyObjectDef(def_use_mgr_00,uVar2);
    OVar1 = opt::Instruction::opcode(pIVar4);
    if (OVar1 == OpLoad) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(pIVar4,0);
      pIVar4 = anon_unknown_19::GetNonCopyObjectDef(def_use_mgr_00,uVar2);
      OVar1 = opt::Instruction::opcode(pIVar4);
      local_51 = false;
      if (OVar1 == OpVariable) {
        uVar2 = opt::Instruction::result_id(pIVar4);
        uVar3 = opt::Instruction::result_id(image_variable);
        local_51 = uVar2 == uVar3;
      }
      this_local._7_1_ = local_51;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConvertToSampledImagePass::DoesSampledImageReferenceImage(
    Instruction* sampled_image_inst, Instruction* image_variable) {
  if (sampled_image_inst->opcode() != spv::Op::OpSampledImage) return false;
  auto* def_use_mgr = context()->get_def_use_mgr();
  auto* image_load = GetNonCopyObjectDef(
      def_use_mgr, sampled_image_inst->GetSingleWordInOperand(0u));
  if (image_load->opcode() != spv::Op::OpLoad) return false;
  auto* image =
      GetNonCopyObjectDef(def_use_mgr, image_load->GetSingleWordInOperand(0u));
  return image->opcode() == spv::Op::OpVariable &&
         image->result_id() == image_variable->result_id();
}